

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetrahedron_monte_carlo.cpp
# Opt level: O3

double tetrahedron01_monomial_integral(int *e)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  lVar2 = 0;
  do {
    if (e[lVar2] < 0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"TETRAHEDRON01_MONOMIAL_INTEGRAL - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  All exponents must be nonnegative.\n");
      exit(1);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  iVar1 = 0;
  dVar6 = 1.0;
  do {
    iVar3 = e[lVar2];
    if (0 < iVar3) {
      dVar7 = 1.0;
      iVar5 = iVar3;
      iVar4 = iVar1;
      do {
        iVar4 = iVar4 + 1;
        dVar6 = (dVar6 * dVar7) / (double)iVar4;
        dVar7 = dVar7 + 1.0;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      iVar1 = iVar1 + iVar3;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  iVar3 = 1;
  do {
    dVar6 = dVar6 / (double)(iVar1 + iVar3);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  return dVar6;
}

Assistant:

double tetrahedron01_monomial_integral ( int e[] )

//****************************************************************************80
//
//  Purpose:
//
//    TETRAHEDRON01_MONOMIAL_INTEGRAL: integrals in the unit tetrahedron in 3D.
//
//  Discussion:
//
//    The monomial is F(X,Y,Z) = X^E(1) * Y^E(2) * Z^E(3).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    15 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int E[3], the exponents.  
//    Each exponent must be nonnegative.
//
//    Output, double TETRAHEDRON01_MONOMIAL_INTEGRAL, the integral.
//
{
  int i;
  double integral;
  int j;
  int k;
  const int m = 3;

  for ( i = 0; i < m; i++ )
  {
    if ( e[i] < 0 )
    {
      std::cerr << "\n";
      std::cerr << "TETRAHEDRON01_MONOMIAL_INTEGRAL - Fatal error!\n";
      std::cerr << "  All exponents must be nonnegative.\n";
      exit ( 1 );
    }
  }

  k = 0;
  integral = 1.0;

  for ( i = 0; i < m; i++ )
  {
    for ( j = 1; j <= e[i]; j++ )
    {
      k = k + 1;
      integral = integral * double( j ) / double( k );
    }
  }

  for ( i = 0; i < m; i++ )
  {
    k = k + 1;
    integral = integral / double( k );
  }

  return integral;
}